

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_relational_expression(xpath_parser *this)

{
  xpath_ast_node *pxVar1;
  xpath_ast_node *pxVar2;
  byte bVar3;
  lexeme_t l;
  lexeme_t lVar4;
  xpath_ast_node *pxVar5;
  
  pxVar1 = parse_additive_expression(this);
  lVar4 = (this->_lexer)._cur_lexeme;
  if (lVar4 - lex_less < 4) {
    pxVar5 = pxVar1;
    do {
      xpath_lexer::next(&this->_lexer);
      pxVar2 = parse_additive_expression(this);
      pxVar1 = (xpath_ast_node *)alloc_node((xpath_parser *)this->_alloc);
      if (lVar4 == lex_less) {
        bVar3 = 4;
      }
      else if (lVar4 == lex_greater) {
        bVar3 = 5;
      }
      else {
        bVar3 = lVar4 == lex_less_or_equal ^ 7;
      }
      pxVar1->_type = bVar3;
      pxVar1->_rettype = '\x04';
      pxVar1->_axis = '\0';
      pxVar1->_test = '\0';
      pxVar1->_left = pxVar5;
      pxVar1->_right = pxVar2;
      pxVar1->_next = (xpath_ast_node *)0x0;
      lVar4 = (this->_lexer)._cur_lexeme;
      pxVar5 = pxVar1;
    } while (lVar4 - lex_less < 4);
  }
  return pxVar1;
}

Assistant:

xpath_ast_node* parse_relational_expression()
		{
			xpath_ast_node* n = parse_additive_expression();

			while (_lexer.current() == lex_less || _lexer.current() == lex_less_or_equal || 
				   _lexer.current() == lex_greater || _lexer.current() == lex_greater_or_equal)
			{
				lexeme_t l = _lexer.current();
				_lexer.next();

				xpath_ast_node* expr = parse_additive_expression();

				n = new (alloc_node()) xpath_ast_node(l == lex_less ? ast_op_less : l == lex_greater ? ast_op_greater :
								l == lex_less_or_equal ? ast_op_less_or_equal : ast_op_greater_or_equal, xpath_type_boolean, n, expr);
			}

			return n;
		}